

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>
fmt::v8::detail::
format_uint<4u,char32_t,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>,unsigned__int128>
          (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_> out,unsigned___int128 value,
          int num_digits,bool upper)

{
  type tVar1;
  detail *this;
  int in_ECX;
  int num_digits_00;
  undefined7 in_register_00000011;
  undefined4 in_register_00000034;
  undefined1 in_stack_ffffffffffffffa8 [16];
  
  tVar1 = to_unsigned<int>(in_ECX);
  this = (detail *)to_pointer<char32_t>((buffer_appender<char32_t>)out.container,(ulong)tVar1);
  num_digits_00 = (int)CONCAT71(in_register_00000011,upper);
  if (this == (detail *)0x0) {
    format_uint<4u,char,unsigned__int128>
              ((detail *)&stack0xffffffffffffffa8,(char *)CONCAT44(in_register_00000034,num_digits),
               (unsigned___int128)in_stack_ffffffffffffffa8,num_digits_00,SUB41(in_ECX,0));
    out = copy_str_noinline<char32_t,char*,std::back_insert_iterator<fmt::v8::detail::buffer<char32_t>>>
                    (&stack0xffffffffffffffa8,&stack0xffffffffffffffa8 + in_ECX,out);
  }
  else {
    format_uint<4u,char32_t,unsigned__int128>
              (this,(char32_t *)CONCAT44(in_register_00000034,num_digits),
               (unsigned___int128)in_stack_ffffffffffffffa8,num_digits_00,SUB41(in_ECX,0));
  }
  return (back_insert_iterator<fmt::v8::detail::buffer<char32_t>_>)out.container;
}

Assistant:

inline auto format_uint(It out, UInt value, int num_digits, bool upper = false)
    -> It {
  if (auto ptr = to_pointer<Char>(out, to_unsigned(num_digits))) {
    format_uint<BASE_BITS>(ptr, value, num_digits, upper);
    return out;
  }
  // Buffer should be large enough to hold all digits (digits / BASE_BITS + 1).
  char buffer[num_bits<UInt>() / BASE_BITS + 1];
  format_uint<BASE_BITS>(buffer, value, num_digits, upper);
  return detail::copy_str_noinline<Char>(buffer, buffer + num_digits, out);
}